

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

long dprintf_DollarString(char *input,char **end)

{
  ushort **ppuVar1;
  int local_24;
  int number;
  char **end_local;
  char *input_local;
  
  local_24 = 0;
  end_local = (char **)input;
  while( true ) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)(uint)*(byte *)end_local] & 0x800) == 0) break;
    local_24 = *(char *)end_local + -0x30 + local_24 * 10;
    end_local = (char **)((long)end_local + 1);
  }
  if ((local_24 == 0) || (*(char *)end_local != '$')) {
    input_local = (char *)0x0;
  }
  else {
    *end = (char *)((long)end_local + 1);
    input_local = (char *)(long)local_24;
  }
  return (long)input_local;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number=0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}